

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

Vector3<double> *
s2pred::GetCircumcenter<double>
          (Vector3<double> *a,Vector3<double> *b,Vector3<double> *c,double *error)

{
  Vector3<double> *in_RDI;
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  dVar6 = a->c_[2] - b->c_[2];
  dVar3 = a->c_[2] + b->c_[2];
  dVar1 = b->c_[0];
  dVar13 = a->c_[0] - dVar1;
  dVar14 = a->c_[1] - b->c_[1];
  dVar11 = a->c_[0] + dVar1;
  dVar12 = a->c_[1] + b->c_[1];
  dVar18 = dVar1 - c->c_[0];
  dVar15 = b->c_[1] - c->c_[1];
  dVar16 = b->c_[2] - c->c_[2];
  dVar1 = dVar1 + c->c_[0];
  dVar4 = b->c_[1] + c->c_[1];
  dVar5 = b->c_[2] + c->c_[2];
  dVar17 = dVar11 * dVar6 - dVar13 * dVar3;
  dVar9 = dVar12 * dVar13 - dVar14 * dVar11;
  dVar10 = dVar3 * dVar14 - dVar6 * dVar12;
  dVar20 = dVar5 * dVar15 - dVar16 * dVar4;
  dVar22 = dVar1 * dVar16 - dVar18 * dVar5;
  dVar19 = dVar18 * dVar4 - dVar1 * dVar15;
  auVar2._0_8_ = dVar12 * dVar9;
  auVar2._8_8_ = dVar12;
  auVar7._0_8_ = dVar9 * dVar9 + dVar10 * dVar10 + dVar17 * dVar17;
  auVar7._8_8_ = dVar22 * dVar22 + dVar20 * dVar20 + dVar19 * dVar19;
  dVar21 = dVar3 * dVar17 - auVar2._0_8_;
  dVar9 = dVar11 * dVar9 - dVar10 * dVar3;
  dVar10 = dVar12 * dVar10 - dVar17 * dVar11;
  auVar2 = sqrtpd(auVar2,auVar7);
  auVar8._8_8_ = dVar16 * dVar16 + dVar15 * dVar15 + dVar18 * dVar18;
  auVar8._0_8_ = dVar6 * dVar6 + dVar14 * dVar14 + dVar13 * dVar13;
  auVar8 = sqrtpd(auVar7,auVar8);
  dVar6 = dVar19 * dVar1 - dVar20 * dVar5;
  dVar1 = dVar4 * dVar20 - dVar22 * dVar1;
  dVar3 = dVar5 * dVar22 - dVar19 * dVar4;
  *error = (auVar2._8_8_ + auVar2._0_8_) * 2.732694335895138e-30 +
           ((auVar8._8_8_ + auVar8._0_8_) * 8.881784197001252e-16 + 6.391467286720804e-15) *
           auVar2._0_8_ * auVar2._8_8_ + 1.8669045833583425e-60;
  in_RDI->c_[0] = dVar9 * dVar1 - dVar6 * dVar10;
  in_RDI->c_[1] = dVar10 * dVar3 - dVar1 * dVar21;
  in_RDI->c_[2] = dVar21 * dVar6 - dVar3 * dVar9;
  return in_RDI;
}

Assistant:

Vector3<T> GetCircumcenter(const Vector3<T>& a, const Vector3<T>& b,
                           const Vector3<T>& c, T* error) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // We compute the circumcenter using the intersection of the perpendicular
  // bisectors of AB and BC.  The formula is essentially
  //
  //    Z = ((A x B) x (A + B)) x ((B x C) x (B + C)),
  //
  // except that we compute the cross product (A x B) as (A - B) x (A + B)
  // (and similarly for B x C) since this is much more stable when the inputs
  // are unit vectors.
  Vector3<T> ab_diff = a - b, ab_sum = a + b;
  Vector3<T> bc_diff = b - c, bc_sum = b + c;
  Vector3<T> nab = ab_diff.CrossProd(ab_sum);
  T nab_len = nab.Norm();
  T ab_len = ab_diff.Norm();
  Vector3<T> nbc = bc_diff.CrossProd(bc_sum);
  T nbc_len = nbc.Norm();
  T bc_len = bc_diff.Norm();
  Vector3<T> mab = nab.CrossProd(ab_sum);
  Vector3<T> mbc = nbc.CrossProd(bc_sum);
  *error = (((16 + 24 * sqrt(3)) * T_ERR +
                8 * DBL_ERR * (ab_len + bc_len)) * nab_len * nbc_len +
               128 * sqrt(3) * DBL_ERR * T_ERR * (nab_len + nbc_len) +
               3 * 4096 * DBL_ERR * DBL_ERR * T_ERR * T_ERR);
  return mab.CrossProd(mbc);
}